

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::ReporterRegistrar<Catch::JunitReporter>::ReporterFactory::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,ReporterFactory *this)

{
  size_type sVar1;
  pointer __dest;
  size_type __dnew;
  size_type local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_20 = 0x4e;
  __dest = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_20);
  sVar1 = local_20;
  (__return_storage_ptr__->_M_dataplus)._M_p = __dest;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
  memcpy(__dest,"Reports test results in an XML format that looks like Ant\'s junitreport target",
         0x4e);
  __return_storage_ptr__->_M_string_length = sVar1;
  __dest[sVar1] = '\0';
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getDescription() const {
                return T::getDescription();
            }